

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

Value * duckdb::DisabledCompressionMethodsSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  _Base_ptr p_Var1;
  DBConfig *pDVar2;
  CompressionType type;
  CompressionType extraout_DL;
  undefined8 extraout_RDX;
  _Rb_tree_header *p_Var3;
  undefined1 auVar4 [16];
  string result;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  Value *local_78;
  string local_70;
  string local_50;
  
  pDVar2 = DBConfig::GetConfig(context);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  p_Var1 = (pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = p_Var1;
  p_Var3 = &(pDVar2->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    local_78 = __return_storage_ptr__;
    do {
      type = auVar4[8];
      if (local_90 != 0) {
        ::std::__cxx11::string::append((char *)&local_98);
        type = extraout_DL;
      }
      CompressionTypeToString_abi_cxx11_
                (&local_70,(duckdb *)(ulong)(byte)(char)auVar4._0_8_[1]._M_color,type);
      ::std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      auVar4 = ::std::_Rb_tree_increment(auVar4._0_8_);
      __return_storage_ptr__ = local_78;
    } while ((_Rb_tree_header *)auVar4._0_8_ != p_Var3);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_98 + local_90);
  Value::Value(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Value DisabledCompressionMethodsSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	string result;
	for (auto &optimizer : config.options.disabled_compression_methods) {
		if (!result.empty()) {
			result += ",";
		}
		result += CompressionTypeToString(optimizer);
	}
	return Value(result);
}